

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O2

SynNamespaceElement * __thiscall ParseContext::PushNamespace(ParseContext *this,SynIdentifier *name)

{
  SynNamespaceElement *parent;
  bool bVar1;
  int iVar2;
  SynNamespaceElement **ppSVar3;
  undefined4 extraout_var;
  uint i;
  uint index;
  SynNamespaceElement *ns;
  
  parent = this->currentNamespace;
  for (index = 0; index < (this->namespaceList).count; index = index + 1) {
    ppSVar3 = SmallArray<SynNamespaceElement_*,_32U>::operator[](&this->namespaceList,index);
    ns = *ppSVar3;
    if (ns->parent == parent) {
      bVar1 = InplaceStr::operator==(&ns->name->name,&name->name);
      if (bVar1) goto LAB_00111431;
    }
  }
  iVar2 = (*this->allocator->_vptr_Allocator[2])(this->allocator,0x18);
  SynNamespaceElement::SynNamespaceElement
            ((SynNamespaceElement *)CONCAT44(extraout_var,iVar2),parent,name);
  ns = (SynNamespaceElement *)CONCAT44(extraout_var,iVar2);
  SmallArray<SynNamespaceElement_*,_32U>::push_back(&this->namespaceList,&ns);
LAB_00111431:
  this->currentNamespace = ns;
  return ns;
}

Assistant:

SynNamespaceElement* ParseContext::PushNamespace(SynIdentifier *name)
{
	SynNamespaceElement *current = currentNamespace;

	// Search for existing namespace in the same context
	for(unsigned i = 0; i < namespaceList.size(); i++)
	{
		SynNamespaceElement *ns = namespaceList[i];

		if(ns->parent == current && ns->name->name == name->name)
		{
			currentNamespace = ns;
			return ns;
		}
	}

	// Create new namespace
	SynNamespaceElement *ns = new (get<SynNamespaceElement>()) SynNamespaceElement(current, name);
	namespaceList.push_back(ns);

	currentNamespace = ns;
	return ns;
}